

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

jsgf_t * jsgf_parse_file(char *filename,jsgf_t *parent)

{
  int iVar1;
  jsgf_t *jsgf_00;
  jsgf_t *local_48;
  FILE *local_40;
  FILE *in;
  int yyrv;
  jsgf_t *jsgf;
  yyscan_t yyscanner;
  jsgf_t *parent_local;
  char *filename_local;
  
  local_40 = (FILE *)0x0;
  yyscanner = parent;
  parent_local = (jsgf_t *)filename;
  yylex_init(&jsgf);
  if (parent_local == (jsgf_t *)0x0) {
    yyset_in(_stdin,jsgf);
  }
  else {
    local_40 = fopen((char *)parent_local,"r");
    if (local_40 == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                     ,0x352,"Failed to open %s for parsing",parent_local);
      return (jsgf_t *)0x0;
    }
    yyset_in((FILE *)local_40,jsgf);
  }
  jsgf_00 = jsgf_grammar_new((jsgf_t *)yyscanner);
  if (yyscanner == (yyscan_t)0x0) {
    jsgf_set_search_path(jsgf_00,(char *)parent_local);
  }
  iVar1 = yyparse(jsgf,jsgf_00);
  if (iVar1 == 0) {
    if (local_40 != (FILE *)0x0) {
      fclose(local_40);
    }
    yylex_destroy(jsgf);
    filename_local = (char *)jsgf_00;
  }
  else {
    if (parent_local == (jsgf_t *)0x0) {
      local_48 = (jsgf_t *)0x11dc45;
    }
    else {
      local_48 = parent_local;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
            ,0x360,"Failed to parse JSGF grammar from \'%s\'\n",local_48);
    jsgf_grammar_free(jsgf_00);
    yylex_destroy(jsgf);
    filename_local = (char *)0x0;
  }
  return (jsgf_t *)filename_local;
}

Assistant:

jsgf_t *
jsgf_parse_file(const char *filename, jsgf_t * parent)
{
    yyscan_t yyscanner;
    jsgf_t *jsgf;
    int yyrv;
    FILE *in = NULL;

    yylex_init(&yyscanner);
    if (filename == NULL) {
        yyset_in(stdin, yyscanner);
    }
    else {
        in = fopen(filename, "r");
        if (in == NULL) {
            E_ERROR_SYSTEM("Failed to open %s for parsing", filename);
            return NULL;
        }
        yyset_in(in, yyscanner);
    }

    jsgf = jsgf_grammar_new(parent);

    if (!parent)
        jsgf_set_search_path(jsgf, filename);

    yyrv = yyparse(yyscanner, jsgf);
    if (yyrv != 0) {
        E_ERROR("Failed to parse JSGF grammar from '%s'\n",
                filename ? filename : "(stdin)");
        jsgf_grammar_free(jsgf);
        yylex_destroy(yyscanner);
        return NULL;
    }
    if (in)
        fclose(in);
    yylex_destroy(yyscanner);

    return jsgf;
}